

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

void console::append_utf8(char32_t ch,string *out)

{
  char in_SIL;
  uint in_EDI;
  
  if (in_EDI < 0x80) {
    std::__cxx11::string::push_back(in_SIL);
  }
  else if (in_EDI < 0x800) {
    std::__cxx11::string::push_back(in_SIL);
    std::__cxx11::string::push_back(in_SIL);
  }
  else if (in_EDI < 0x10000) {
    std::__cxx11::string::push_back(in_SIL);
    std::__cxx11::string::push_back(in_SIL);
    std::__cxx11::string::push_back(in_SIL);
  }
  else if (in_EDI < 0x110000) {
    std::__cxx11::string::push_back(in_SIL);
    std::__cxx11::string::push_back(in_SIL);
    std::__cxx11::string::push_back(in_SIL);
    std::__cxx11::string::push_back(in_SIL);
  }
  return;
}

Assistant:

static void append_utf8(char32_t ch, std::string & out) {
        if (ch <= 0x7F) {
            out.push_back(static_cast<unsigned char>(ch));
        } else if (ch <= 0x7FF) {
            out.push_back(static_cast<unsigned char>(0xC0 | ((ch >> 6) & 0x1F)));
            out.push_back(static_cast<unsigned char>(0x80 | (ch & 0x3F)));
        } else if (ch <= 0xFFFF) {
            out.push_back(static_cast<unsigned char>(0xE0 | ((ch >> 12) & 0x0F)));
            out.push_back(static_cast<unsigned char>(0x80 | ((ch >> 6) & 0x3F)));
            out.push_back(static_cast<unsigned char>(0x80 | (ch & 0x3F)));
        } else if (ch <= 0x10FFFF) {
            out.push_back(static_cast<unsigned char>(0xF0 | ((ch >> 18) & 0x07)));
            out.push_back(static_cast<unsigned char>(0x80 | ((ch >> 12) & 0x3F)));
            out.push_back(static_cast<unsigned char>(0x80 | ((ch >> 6) & 0x3F)));
            out.push_back(static_cast<unsigned char>(0x80 | (ch & 0x3F)));
        } else {
            // Invalid Unicode code point
        }
    }